

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

int __thiscall
doctest::detail::MultiLaneAtomic<int>::fetch_add
          (MultiLaneAtomic<int> *this,int arg,memory_order order)

{
  atomic<int> *paVar1;
  undefined4 in_EDX;
  int in_ESI;
  MultiLaneAtomic<int> *in_stack_ffffffffffffffd0;
  int local_18;
  
  paVar1 = myAtomic(in_stack_ffffffffffffffd0);
  switch(in_EDX) {
  case 1:
  case 2:
    LOCK();
    local_18 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + in_ESI;
    UNLOCK();
    break;
  case 3:
    LOCK();
    local_18 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + in_ESI;
    UNLOCK();
    break;
  case 4:
    LOCK();
    local_18 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + in_ESI;
    UNLOCK();
    break;
  case 5:
    LOCK();
    local_18 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + in_ESI;
    UNLOCK();
    break;
  default:
    LOCK();
    local_18 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + in_ESI;
    UNLOCK();
  }
  return local_18;
}

Assistant:

T fetch_add(T arg, std::memory_order order = std::memory_order_seq_cst) DOCTEST_NOEXCEPT {
            return myAtomic().fetch_add(arg, order);
        }